

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  byte bVar1;
  ushort uVar2;
  stbi__uint32 sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  undefined8 uVar8;
  stbi_uc sVar9;
  byte bVar10;
  uchar uVar11;
  char cVar12;
  stbi__uint16 sVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  stbi__uint32 sVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  void *pvVar26;
  stbi__context *data;
  stbi__uint16 *psVar27;
  float *data_00;
  stbi_uc *psVar28;
  byte *pbVar29;
  uchar *puVar30;
  uint uVar31;
  uint uVar32;
  char *pcVar33;
  long lVar34;
  ulong uVar35;
  stbi__uint16 *psVar36;
  undefined4 in_register_00000084;
  stbi_uc *two_back;
  stbi__result_info *ri_00;
  ulong uVar37;
  uint uVar38;
  stbi__uint32 sVar39;
  ulong uVar40;
  long *in_FS_OFFSET;
  bool bVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar122 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  int iVar152;
  int iVar156;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  stbi_uc pal [256] [4];
  stbi__uint16 *local_89b8;
  stbi__uint16 *local_8960;
  stbi__uint16 *local_8958;
  int local_8944;
  stbi__bmp_data local_88dc;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  two_back = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  iVar14 = stbi__check_png_header(s);
  psVar28 = s->img_buffer_original;
  s->img_buffer = psVar28;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar14 != 0) {
    if ((uint)req_comp < 5) {
      local_88a8._0_8_ = s;
      iVar14 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      psVar27 = (stbi__uint16 *)local_88a8.history;
      uVar8 = local_88a8._0_8_;
      psVar36 = (stbi__uint16 *)0x0;
      if (iVar14 != 0) {
        iVar14 = 8;
        if ((8 < local_88a8.flags) && (iVar14 = 0x10, local_88a8.flags != 0x10)) {
          lVar34 = *in_FS_OFFSET;
          pcVar33 = "bad bits_per_channel";
          goto LAB_001b6483;
        }
        ri->bits_per_channel = iVar14;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar14 = *(int *)(local_88a8._0_8_ + 0xc), iVar14 != req_comp)) {
          if (local_88a8.flags < 9) {
            psVar27 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)psVar27,iVar14,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            psVar27 = stbi__convert_format16
                                (psVar27,iVar14,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar8 + 0xc) = req_comp;
          if (psVar27 == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)local_88a8._0_8_;
        *y = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar36 = psVar27;
        if (comp != (int *)0x0) {
          *comp = *(int *)(local_88a8._0_8_ + 8);
        }
      }
      free(local_88a8.history);
      local_88a8.history = (stbi_uc *)0x0;
      free(local_88a8.background);
      local_88a8.background = (stbi_uc *)0x0;
      free(local_88a8.out);
      return psVar36;
    }
    lVar34 = *in_FS_OFFSET;
    pcVar33 = "bad req_comp";
    goto LAB_001b6483;
  }
  if (psVar28 < s->img_buffer_original_end) {
LAB_001b64bf:
    s->img_buffer = psVar28 + 1;
    if (*psVar28 != 'B') goto LAB_001b663d;
    psVar28 = s->img_buffer;
    if (s->img_buffer_end <= psVar28) {
      if (s->read_from_callbacks == 0) goto LAB_001b663d;
      stbi__refill_buffer(s);
      psVar28 = s->img_buffer;
    }
    s->img_buffer = psVar28 + 1;
    if (*psVar28 != 'M') goto LAB_001b663d;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar15 = stbi__get16le(s);
    iVar14 = stbi__get16le(s);
    uVar15 = iVar14 << 0x10 | uVar15;
    if ((((0x38 < uVar15) || ((0x100010000001000U >> ((ulong)uVar15 & 0x3f) & 1) == 0)) &&
        (uVar15 != 0x7c)) && (uVar15 != 0x6c)) goto LAB_001b663d;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    local_88dc.all_a = 0xff;
    pvVar26 = stbi__bmp_parse_header(s,&local_88dc);
    uVar15 = local_88dc.all_a;
    if (pvVar26 == (void *)0x0) {
      return (void *)0x0;
    }
    sVar17 = s->img_y;
    uVar31 = -sVar17;
    if (0 < (int)sVar17) {
      uVar31 = sVar17;
    }
    s->img_y = uVar31;
    if ((uVar31 < 0x1000001) && (uVar32 = s->img_x, uVar32 < 0x1000001)) {
      if (local_88dc.hsz == 0xc) {
        if (local_88dc.bpp < 0x18) {
          uVar35 = (ulong)(uint)(((local_88dc.offset - local_88dc.extra_read) + -0x18) / 3);
        }
        else {
LAB_001b6b26:
          uVar35 = 0;
        }
      }
      else {
        if (0xf < local_88dc.bpp) goto LAB_001b6b26;
        uVar35 = (ulong)(uint)(local_88dc.offset - (local_88dc.extra_read + local_88dc.hsz) >> 2);
      }
      iVar14 = (int)uVar35;
      if ((iVar14 == 0) &&
         (s->img_buffer + ((long)s->callback_already_read - (long)s->img_buffer_original) !=
          (stbi_uc *)(long)local_88dc.offset)) {
        lVar34 = *in_FS_OFFSET;
        pcVar33 = "bad offset";
        goto LAB_001b6483;
      }
      uVar38 = local_88dc.ma ^ 0xff000000;
      s->img_n = 4 - (uint)(local_88dc.ma == 0 || local_88dc.bpp == 0x18 && uVar38 == 0);
      iVar16 = req_comp;
      if (req_comp < 3) {
        iVar16 = s->img_n;
      }
      iVar19 = stbi__mad3sizes_valid(iVar16,uVar32,uVar31,0);
      if (iVar19 == 0) goto LAB_001b712c;
      local_89b8 = (stbi__uint16 *)stbi__malloc_mad3(iVar16,uVar32,uVar31,0);
      if (local_89b8 != (stbi__uint16 *)0x0) {
        if (local_88dc.bpp < 0x10) {
          if (iVar14 < 0x101 && iVar14 != 0) {
            if (0 < iVar14) {
              uVar40 = 0;
              do {
                psVar28 = s->img_buffer;
                if (psVar28 < s->img_buffer_end) {
LAB_001b6d81:
                  s->img_buffer = psVar28 + 1;
                  sVar9 = *psVar28;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar28 = s->img_buffer;
                    goto LAB_001b6d81;
                  }
                  sVar9 = '\0';
                }
                local_88a8.pal[uVar40 - 0xd][2] = sVar9;
                psVar28 = s->img_buffer;
                if (psVar28 < s->img_buffer_end) {
LAB_001b6dc5:
                  s->img_buffer = psVar28 + 1;
                  sVar9 = *psVar28;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar28 = s->img_buffer;
                    goto LAB_001b6dc5;
                  }
                  sVar9 = '\0';
                }
                local_88a8.pal[uVar40 - 0xd][1] = sVar9;
                psVar28 = s->img_buffer;
                if (psVar28 < s->img_buffer_end) {
LAB_001b6e09:
                  s->img_buffer = psVar28 + 1;
                  sVar9 = *psVar28;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar28 = s->img_buffer;
                    goto LAB_001b6e09;
                  }
                  sVar9 = '\0';
                }
                local_88a8.pal[uVar40 - 0xd][0] = sVar9;
                if (local_88dc.hsz != 0xc) {
                  psVar28 = s->img_buffer;
                  if (s->img_buffer_end <= psVar28) {
                    if (s->read_from_callbacks == 0) goto LAB_001b6e5b;
                    stbi__refill_buffer(s);
                    psVar28 = s->img_buffer;
                  }
                  s->img_buffer = psVar28 + 1;
                }
LAB_001b6e5b:
                local_88a8.pal[uVar40 - 0xd][3] = 0xff;
                uVar40 = uVar40 + 1;
              } while (uVar35 != uVar40);
            }
            stbi__skip(s,(iVar14 * (local_88dc.hsz == 0xc | 0xfffffffc) + local_88dc.offset) -
                         (local_88dc.hsz + local_88dc.extra_read));
            if (local_88dc.bpp == 8) {
              uVar31 = s->img_x;
            }
            else if (local_88dc.bpp == 4) {
              uVar31 = s->img_x + 1 >> 1;
            }
            else {
              if (local_88dc.bpp != 1) {
                free(local_89b8);
                lVar34 = *in_FS_OFFSET;
                pcVar33 = "bad bpp";
                goto LAB_001b6483;
              }
              uVar31 = s->img_x + 7 >> 3;
            }
            local_8960._0_4_ = -uVar31 & 3;
            if (local_88dc.bpp == 1) {
              if (0 < (int)s->img_y) {
                iVar14 = 0;
                iVar19 = 0;
                do {
                  pbVar29 = s->img_buffer;
                  if (pbVar29 < s->img_buffer_end) {
LAB_001b71b3:
                    s->img_buffer = pbVar29 + 1;
                    uVar31 = (uint)*pbVar29;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar29 = s->img_buffer;
                      goto LAB_001b71b3;
                    }
                    uVar31 = 0;
                  }
                  uVar32 = 7;
                  sVar39 = 1;
                  do {
                    sVar3 = s->img_x;
                    if ((int)sVar3 <= (int)(sVar39 - 1)) break;
                    uVar35 = (ulong)((uVar31 >> (uVar32 & 0x1f) & 1) != 0);
                    *(stbi_uc *)((long)local_89b8 + (long)iVar14) = local_88a8.pal[uVar35 - 0xd][0];
                    *(stbi_uc *)((long)local_89b8 + (long)iVar14 + 1) =
                         local_88a8.pal[uVar35 - 0xd][1];
                    *(stbi_uc *)((long)local_89b8 + (long)iVar14 + 2) =
                         local_88a8.pal[uVar35 - 0xd][2];
                    iVar20 = iVar14 + 3;
                    if (iVar16 == 4) {
                      *(uchar *)((long)local_89b8 + (long)iVar14 + 3) = 0xff;
                      iVar20 = iVar14 + 4;
                    }
                    iVar14 = iVar20;
                    if (sVar39 != sVar3) {
                      if ((int)uVar32 < 1) {
                        pbVar29 = s->img_buffer;
                        if (pbVar29 < s->img_buffer_end) {
LAB_001b726c:
                          s->img_buffer = pbVar29 + 1;
                          uVar31 = (uint)*pbVar29;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar29 = s->img_buffer;
                            goto LAB_001b726c;
                          }
                          uVar31 = 0;
                        }
                        uVar32 = 7;
                      }
                      else {
                        uVar32 = uVar32 - 1;
                      }
                    }
                    bVar42 = sVar39 != sVar3;
                    sVar39 = sVar39 + 1;
                  } while (bVar42);
                  stbi__skip(s,(uint)local_8960);
                  iVar19 = iVar19 + 1;
                } while (iVar19 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              uVar35 = 0;
              iVar14 = 0;
              do {
                if (0 < (int)s->img_x) {
                  iVar19 = 0;
                  do {
                    pbVar29 = s->img_buffer;
                    if (pbVar29 < s->img_buffer_end) {
LAB_001b7326:
                      s->img_buffer = pbVar29 + 1;
                      uVar31 = (uint)*pbVar29;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar29 = s->img_buffer;
                        goto LAB_001b7326;
                      }
                      uVar31 = 0;
                    }
                    uVar32 = uVar31 >> 4;
                    if (local_88dc.bpp != 4) {
                      uVar32 = uVar31;
                    }
                    uVar40 = (ulong)uVar32;
                    uVar31 = uVar31 & 0xf;
                    if (local_88dc.bpp != 4) {
                      uVar31 = 0;
                    }
                    lVar34 = (long)(int)uVar35;
                    uVar37 = lVar34 + 3;
                    *(stbi_uc *)((long)local_89b8 + lVar34) = local_88a8.pal[uVar40 - 0xd][0];
                    *(stbi_uc *)((long)local_89b8 + lVar34 + 1) = local_88a8.pal[uVar40 - 0xd][1];
                    *(stbi_uc *)((long)local_89b8 + lVar34 + 2) = local_88a8.pal[uVar40 - 0xd][2];
                    if (iVar16 == 4) {
                      *(uchar *)((long)local_89b8 + lVar34 + 3) = 0xff;
                      uVar37 = (ulong)((int)uVar35 + 4);
                    }
                    sVar39 = s->img_x;
                    if (iVar19 + 1U == sVar39) {
LAB_001b742b:
                      uVar35 = uVar37 & 0xffffffff;
                    }
                    else {
                      if (local_88dc.bpp == 8) {
                        pbVar29 = s->img_buffer;
                        if (s->img_buffer_end <= pbVar29) {
                          if (s->read_from_callbacks == 0) {
                            uVar31 = 0;
                            goto LAB_001b73eb;
                          }
                          stbi__refill_buffer(s);
                          pbVar29 = s->img_buffer;
                        }
                        s->img_buffer = pbVar29 + 1;
                        uVar31 = (uint)*pbVar29;
                      }
LAB_001b73eb:
                      lVar34 = (long)(int)uVar37;
                      uVar35 = lVar34 + 3;
                      uVar40 = (ulong)uVar31;
                      *(stbi_uc *)((long)local_89b8 + lVar34) = local_88a8.pal[uVar40 - 0xd][0];
                      *(stbi_uc *)((long)local_89b8 + lVar34 + 1) = local_88a8.pal[uVar40 - 0xd][1];
                      *(stbi_uc *)((long)local_89b8 + lVar34 + 2) = local_88a8.pal[uVar40 - 0xd][2];
                      if (iVar16 == 4) {
                        uVar37 = (ulong)((int)uVar37 + 4);
                        *(uchar *)((long)local_89b8 + lVar34 + 3) = 0xff;
                        goto LAB_001b742b;
                      }
                    }
                  } while ((iVar19 + 1U != sVar39) && (iVar19 = iVar19 + 2, iVar19 < (int)s->img_x))
                  ;
                }
                stbi__skip(s,(uint)local_8960);
                iVar14 = iVar14 + 1;
              } while (iVar14 < (int)s->img_y);
            }
            goto LAB_001b78bd;
          }
          free(local_89b8);
          lVar34 = *in_FS_OFFSET;
          pcVar33 = "invalid";
          goto LAB_001b6483;
        }
        stbi__skip(s,local_88dc.offset - (local_88dc.hsz + local_88dc.extra_read));
        if (local_88dc.bpp == 0x18) {
          iVar14 = -3;
LAB_001b6f34:
          uVar31 = iVar14 * s->img_x & 3;
        }
        else {
          uVar31 = 0;
          if (local_88dc.bpp == 0x10) {
            iVar14 = -2;
            goto LAB_001b6f34;
          }
        }
        if (local_88dc.bpp == 0x18) {
          bVar42 = false;
LAB_001b6f95:
          bVar41 = false;
        }
        else {
          if (local_88dc.bpp != 0x20) {
            bVar42 = true;
            goto LAB_001b6f95;
          }
          bVar41 = (local_88dc.mr == 0xff0000 && (local_88dc.mg == 0xff00 && local_88dc.mb == 0xff))
                   && uVar38 == 0;
          bVar42 = (local_88dc.mr != 0xff0000 || (local_88dc.mg != 0xff00 || local_88dc.mb != 0xff))
                   || uVar38 != 0;
        }
        iVar14 = 0;
        iVar19 = 0;
        iVar20 = 0;
        local_8944 = 0;
        uVar32 = 0;
        uVar38 = 0;
        uVar21 = 0;
        uVar22 = 0;
        if (bVar42) {
          if (local_88dc.mb != 0 && (local_88dc.mg != 0 && local_88dc.mr != 0)) {
            iVar14 = stbi__high_bit(local_88dc.mr);
            uVar32 = stbi__bitcount(local_88dc.mr);
            iVar19 = stbi__high_bit(local_88dc.mg);
            uVar38 = stbi__bitcount(local_88dc.mg);
            iVar20 = stbi__high_bit(local_88dc.mb);
            uVar21 = stbi__bitcount(local_88dc.mb);
            local_8944 = stbi__high_bit(local_88dc.ma);
            uVar22 = stbi__bitcount(local_88dc.ma);
            if ((uVar22 < 9 && uVar21 < 9) && (uVar38 < 9 && uVar32 < 9)) {
              iVar14 = iVar14 + -7;
              iVar19 = iVar19 + -7;
              iVar20 = iVar20 + -7;
              local_8944 = local_8944 + -7;
              goto LAB_001b74ac;
            }
          }
          free(local_89b8);
          *(char **)(*in_FS_OFFSET + -0x20) = "bad masks";
          bVar7 = false;
        }
        else {
LAB_001b74ac:
          bVar7 = true;
          if (0 < (int)s->img_y) {
            iVar152 = 0;
            local_88b0 = (ulong)(uVar21 << 2);
            local_88b8 = (ulong)(uVar22 << 2);
            iVar25 = 0;
            do {
              if (bVar42) {
                if (0 < (int)s->img_x) {
                  iVar156 = 0;
                  do {
                    uVar23 = stbi__get16le(s);
                    if (local_88dc.bpp != 0x10) {
                      iVar24 = stbi__get16le(s);
                      uVar23 = uVar23 | iVar24 << 0x10;
                    }
                    uVar18 = (uVar23 & local_88dc.mr) >> ((byte)iVar14 & 0x1f);
                    if (iVar14 < 0) {
                      uVar18 = (uVar23 & local_88dc.mr) << (-(byte)iVar14 & 0x1f);
                    }
                    uVar5 = (uVar23 & local_88dc.mg) >> ((byte)iVar19 & 0x1f);
                    if (iVar19 < 0) {
                      uVar5 = (uVar23 & local_88dc.mg) << (-(byte)iVar19 & 0x1f);
                    }
                    iVar24 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                     (uVar38 << 2));
                    bVar10 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[uVar38 << 2];
                    uVar6 = (uVar23 & local_88dc.mb) >> ((byte)iVar20 & 0x1f);
                    if (iVar20 < 0) {
                      uVar6 = (uVar23 & local_88dc.mb) << (-(byte)iVar20 & 0x1f);
                    }
                    iVar4 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table + local_88b0
                                    );
                    bVar1 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b0];
                    *(uchar *)((long)local_89b8 + (long)iVar152) =
                         (uchar)((int)((uVar18 >> (8U - (char)uVar32 & 0x1f)) *
                                      *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                              (uVar32 << 2))) >>
                                (stbi__shiftsigned(unsigned_int,int,int)::shift_table[uVar32 << 2] &
                                0x1f));
                    *(uchar *)((long)local_89b8 + (long)iVar152 + 1) =
                         (uchar)((int)((uVar5 >> (8U - (char)uVar38 & 0x1f)) * iVar24) >>
                                (bVar10 & 0x1f));
                    *(uchar *)((long)local_89b8 + (long)iVar152 + 2) =
                         (uchar)((int)((uVar6 >> (8U - (char)uVar21 & 0x1f)) * iVar4) >>
                                (bVar1 & 0x1f));
                    if (local_88dc.ma == 0) {
                      uVar23 = 0xff;
                    }
                    else {
                      uVar18 = (uVar23 & local_88dc.ma) >> ((byte)local_8944 & 0x1f);
                      if (local_8944 < 0) {
                        uVar18 = (uVar23 & local_88dc.ma) << (-(byte)local_8944 & 0x1f);
                      }
                      uVar23 = (int)((uVar18 >> (8U - (char)uVar22 & 0x1f)) *
                                    *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                            local_88b8)) >>
                               (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b8] &
                               0x1f);
                    }
                    iVar24 = iVar152 + 3;
                    if (iVar16 == 4) {
                      *(uchar *)((long)local_89b8 + (long)iVar152 + 3) = (uchar)uVar23;
                      iVar24 = iVar152 + 4;
                    }
                    iVar152 = iVar24;
                    uVar15 = uVar15 | uVar23;
                    iVar156 = iVar156 + 1;
                  } while (iVar156 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                iVar156 = 0;
                do {
                  puVar30 = s->img_buffer;
                  if (puVar30 < s->img_buffer_end) {
LAB_001b7745:
                    s->img_buffer = puVar30 + 1;
                    uVar11 = *puVar30;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar30 = s->img_buffer;
                      goto LAB_001b7745;
                    }
                    uVar11 = '\0';
                  }
                  *(uchar *)((long)local_89b8 + (long)iVar152 + 2) = uVar11;
                  puVar30 = s->img_buffer;
                  if (puVar30 < s->img_buffer_end) {
LAB_001b778d:
                    s->img_buffer = puVar30 + 1;
                    uVar11 = *puVar30;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar30 = s->img_buffer;
                      goto LAB_001b778d;
                    }
                    uVar11 = '\0';
                  }
                  *(uchar *)((long)local_89b8 + (long)iVar152 + 1) = uVar11;
                  puVar30 = s->img_buffer;
                  if (puVar30 < s->img_buffer_end) {
LAB_001b77d2:
                    s->img_buffer = puVar30 + 1;
                    uVar11 = *puVar30;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar30 = s->img_buffer;
                      goto LAB_001b77d2;
                    }
                    uVar11 = '\0';
                  }
                  *(uchar *)((long)local_89b8 + (long)iVar152) = uVar11;
                  bVar10 = 0xff;
                  if (bVar41) {
                    pbVar29 = s->img_buffer;
                    if (s->img_buffer_end <= pbVar29) {
                      if (s->read_from_callbacks == 0) {
                        bVar10 = 0;
                        goto LAB_001b782a;
                      }
                      stbi__refill_buffer(s);
                      pbVar29 = s->img_buffer;
                    }
                    s->img_buffer = pbVar29 + 1;
                    bVar10 = *pbVar29;
                  }
LAB_001b782a:
                  iVar24 = iVar152 + 3;
                  if (iVar16 == 4) {
                    *(byte *)((long)local_89b8 + (long)iVar152 + 3) = bVar10;
                    iVar24 = iVar152 + 4;
                  }
                  iVar152 = iVar24;
                  uVar15 = uVar15 | bVar10;
                  iVar156 = iVar156 + 1;
                } while (iVar156 < (int)s->img_x);
              }
              stbi__skip(s,uVar31);
              iVar25 = iVar25 + 1;
            } while (iVar25 < (int)s->img_y);
            bVar7 = true;
          }
        }
        if (!bVar7) {
          return (void *)0x0;
        }
LAB_001b78bd:
        auVar79 = _DAT_002568c0;
        auVar126 = _DAT_002568b0;
        auVar75 = _DAT_002568a0;
        auVar54 = _DAT_00256890;
        auVar128 = _DAT_00255300;
        auVar45 = _DAT_002552f0;
        auVar122 = _DAT_0024d060;
        if (((iVar16 == 4) && (uVar15 == 0)) &&
           (uVar15 = s->img_x * s->img_y * 4 - 1, -1 < (int)uVar15)) {
          uVar31 = uVar15 >> 2;
          auVar80._4_4_ = 0;
          auVar80._0_4_ = uVar31;
          auVar80._8_4_ = uVar31;
          auVar80._12_4_ = 0;
          puVar30 = (uchar *)((long)local_89b8 + (ulong)uVar15);
          uVar35 = 0;
          auVar52._8_4_ = 0xffffffff;
          auVar52._0_8_ = 0xffffffffffffffff;
          auVar52._12_4_ = 0xffffffff;
          do {
            auVar129._8_4_ = (int)uVar35;
            auVar129._0_8_ = uVar35;
            auVar129._12_4_ = (int)(uVar35 >> 0x20);
            auVar131 = auVar80 | auVar122;
            auVar133 = (auVar129 | auVar128) ^ auVar122;
            iVar14 = auVar131._0_4_;
            iVar152 = -(uint)(iVar14 < auVar133._0_4_);
            iVar19 = auVar131._4_4_;
            auVar135._4_4_ = -(uint)(iVar19 < auVar133._4_4_);
            iVar20 = auVar131._8_4_;
            iVar156 = -(uint)(iVar20 < auVar133._8_4_);
            iVar25 = auVar131._12_4_;
            auVar135._12_4_ = -(uint)(iVar25 < auVar133._12_4_);
            auVar145._4_4_ = iVar152;
            auVar145._0_4_ = iVar152;
            auVar145._8_4_ = iVar156;
            auVar145._12_4_ = iVar156;
            auVar131 = pshuflw(in_XMM1,auVar145,0xe8);
            auVar134._4_4_ = -(uint)(auVar133._4_4_ == iVar19);
            auVar134._12_4_ = -(uint)(auVar133._12_4_ == iVar25);
            auVar134._0_4_ = auVar134._4_4_;
            auVar134._8_4_ = auVar134._12_4_;
            auVar57 = pshuflw(in_XMM2,auVar134,0xe8);
            auVar135._0_4_ = auVar135._4_4_;
            auVar135._8_4_ = auVar135._12_4_;
            auVar133 = pshuflw(auVar131,auVar135,0xe8);
            auVar131 = (auVar133 | auVar57 & auVar131) ^ auVar52;
            auVar131 = packssdw(auVar131,auVar131);
            if ((auVar131 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *puVar30 = 0xff;
            }
            auVar135 = auVar134 & auVar145 | auVar135;
            auVar131 = packssdw(auVar135,auVar135);
            auVar131 = packssdw(auVar131 ^ auVar52,auVar131 ^ auVar52);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131._0_4_ >> 8 & 1) != 0) {
              puVar30[-4] = 0xff;
            }
            auVar131 = (auVar129 | auVar45) ^ auVar122;
            auVar133._0_4_ = -(uint)(iVar14 < auVar131._0_4_);
            auVar133._4_4_ = -(uint)(iVar19 < auVar131._4_4_);
            auVar133._8_4_ = -(uint)(iVar20 < auVar131._8_4_);
            auVar133._12_4_ = -(uint)(iVar25 < auVar131._12_4_);
            auVar57._4_4_ = auVar133._0_4_;
            auVar57._0_4_ = auVar133._0_4_;
            auVar57._8_4_ = auVar133._8_4_;
            auVar57._12_4_ = auVar133._8_4_;
            iVar152 = -(uint)(auVar131._4_4_ == iVar19);
            iVar156 = -(uint)(auVar131._12_4_ == iVar25);
            auVar146._4_4_ = iVar152;
            auVar146._0_4_ = iVar152;
            auVar146._8_4_ = iVar156;
            auVar146._12_4_ = iVar156;
            auVar153._4_4_ = auVar133._4_4_;
            auVar153._0_4_ = auVar133._4_4_;
            auVar153._8_4_ = auVar133._12_4_;
            auVar153._12_4_ = auVar133._12_4_;
            auVar131 = auVar146 & auVar57 | auVar153;
            auVar131 = packssdw(auVar131,auVar131);
            auVar131 = packssdw(auVar131 ^ auVar52,auVar131 ^ auVar52);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131._0_4_ >> 0x10 & 1) != 0) {
              puVar30[-8] = 0xff;
            }
            auVar131 = pshufhw(auVar131,auVar57,0x84);
            auVar57 = pshufhw(auVar133,auVar146,0x84);
            auVar133 = pshufhw(auVar131,auVar153,0x84);
            auVar131 = (auVar133 | auVar57 & auVar131) ^ auVar52;
            auVar131 = packssdw(auVar131,auVar131);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131._0_4_ >> 0x18 & 1) != 0) {
              puVar30[-0xc] = 0xff;
            }
            auVar131 = (auVar129 | auVar79) ^ auVar122;
            auVar58._0_4_ = -(uint)(iVar14 < auVar131._0_4_);
            auVar58._4_4_ = -(uint)(iVar19 < auVar131._4_4_);
            auVar58._8_4_ = -(uint)(iVar20 < auVar131._8_4_);
            auVar58._12_4_ = -(uint)(iVar25 < auVar131._12_4_);
            auVar147._4_4_ = auVar58._0_4_;
            auVar147._0_4_ = auVar58._0_4_;
            auVar147._8_4_ = auVar58._8_4_;
            auVar147._12_4_ = auVar58._8_4_;
            auVar57 = pshuflw(auVar153,auVar147,0xe8);
            auVar49._0_4_ = -(uint)(auVar131._0_4_ == iVar14);
            auVar49._4_4_ = -(uint)(auVar131._4_4_ == iVar19);
            auVar49._8_4_ = -(uint)(auVar131._8_4_ == iVar20);
            auVar49._12_4_ = -(uint)(auVar131._12_4_ == iVar25);
            auVar136._4_4_ = auVar49._4_4_;
            auVar136._0_4_ = auVar49._4_4_;
            auVar136._8_4_ = auVar49._12_4_;
            auVar136._12_4_ = auVar49._12_4_;
            auVar131 = pshuflw(auVar49,auVar136,0xe8);
            auVar137._4_4_ = auVar58._4_4_;
            auVar137._0_4_ = auVar58._4_4_;
            auVar137._8_4_ = auVar58._12_4_;
            auVar137._12_4_ = auVar58._12_4_;
            auVar133 = pshuflw(auVar58,auVar137,0xe8);
            auVar131 = packssdw(auVar131 & auVar57,(auVar133 | auVar131 & auVar57) ^ auVar52);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar30[-0x10] = 0xff;
            }
            auVar137 = auVar136 & auVar147 | auVar137;
            auVar133 = packssdw(auVar137,auVar137);
            auVar131 = packssdw(auVar131,auVar133 ^ auVar52);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131._4_2_ >> 8 & 1) != 0) {
              puVar30[-0x14] = 0xff;
            }
            auVar131 = (auVar129 | auVar126) ^ auVar122;
            auVar59._0_4_ = -(uint)(iVar14 < auVar131._0_4_);
            auVar59._4_4_ = -(uint)(iVar19 < auVar131._4_4_);
            auVar59._8_4_ = -(uint)(iVar20 < auVar131._8_4_);
            auVar59._12_4_ = -(uint)(iVar25 < auVar131._12_4_);
            auVar138._4_4_ = auVar59._0_4_;
            auVar138._0_4_ = auVar59._0_4_;
            auVar138._8_4_ = auVar59._8_4_;
            auVar138._12_4_ = auVar59._8_4_;
            iVar152 = -(uint)(auVar131._4_4_ == iVar19);
            iVar156 = -(uint)(auVar131._12_4_ == iVar25);
            auVar148._4_4_ = iVar152;
            auVar148._0_4_ = iVar152;
            auVar148._8_4_ = iVar156;
            auVar148._12_4_ = iVar156;
            auVar154._4_4_ = auVar59._4_4_;
            auVar154._0_4_ = auVar59._4_4_;
            auVar154._8_4_ = auVar59._12_4_;
            auVar154._12_4_ = auVar59._12_4_;
            auVar131 = auVar148 & auVar138 | auVar154;
            auVar131 = packssdw(auVar131,auVar131);
            auVar131 = packssdw(auVar131 ^ auVar52,auVar131 ^ auVar52);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar30[-0x18] = 0xff;
            }
            auVar131 = pshufhw(auVar131,auVar138,0x84);
            auVar57 = pshufhw(auVar59,auVar148,0x84);
            auVar133 = pshufhw(auVar131,auVar154,0x84);
            auVar131 = (auVar133 | auVar57 & auVar131) ^ auVar52;
            auVar131 = packssdw(auVar131,auVar131);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131._6_2_ >> 8 & 1) != 0) {
              puVar30[-0x1c] = 0xff;
            }
            auVar131 = (auVar129 | auVar75) ^ auVar122;
            auVar60._0_4_ = -(uint)(iVar14 < auVar131._0_4_);
            auVar60._4_4_ = -(uint)(iVar19 < auVar131._4_4_);
            auVar60._8_4_ = -(uint)(iVar20 < auVar131._8_4_);
            auVar60._12_4_ = -(uint)(iVar25 < auVar131._12_4_);
            auVar149._4_4_ = auVar60._0_4_;
            auVar149._0_4_ = auVar60._0_4_;
            auVar149._8_4_ = auVar60._8_4_;
            auVar149._12_4_ = auVar60._8_4_;
            auVar57 = pshuflw(auVar154,auVar149,0xe8);
            auVar50._0_4_ = -(uint)(auVar131._0_4_ == iVar14);
            auVar50._4_4_ = -(uint)(auVar131._4_4_ == iVar19);
            auVar50._8_4_ = -(uint)(auVar131._8_4_ == iVar20);
            auVar50._12_4_ = -(uint)(auVar131._12_4_ == iVar25);
            auVar139._4_4_ = auVar50._4_4_;
            auVar139._0_4_ = auVar50._4_4_;
            auVar139._8_4_ = auVar50._12_4_;
            auVar139._12_4_ = auVar50._12_4_;
            auVar131 = pshuflw(auVar50,auVar139,0xe8);
            auVar140._4_4_ = auVar60._4_4_;
            auVar140._0_4_ = auVar60._4_4_;
            auVar140._8_4_ = auVar60._12_4_;
            auVar140._12_4_ = auVar60._12_4_;
            auVar133 = pshuflw(auVar60,auVar140,0xe8);
            auVar133 = (auVar133 | auVar131 & auVar57) ^ auVar52;
            auVar133 = packssdw(auVar133,auVar133);
            auVar131 = packsswb(auVar131 & auVar57,auVar133);
            if ((auVar131 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar30[-0x20] = 0xff;
            }
            auVar140 = auVar139 & auVar149 | auVar140;
            auVar133 = packssdw(auVar140,auVar140);
            auVar133 = packssdw(auVar133 ^ auVar52,auVar133 ^ auVar52);
            auVar131 = packsswb(auVar131,auVar133);
            if ((auVar131._8_2_ >> 8 & 1) != 0) {
              puVar30[-0x24] = 0xff;
            }
            auVar131 = (auVar129 | auVar54) ^ auVar122;
            auVar61._0_4_ = -(uint)(iVar14 < auVar131._0_4_);
            auVar61._4_4_ = -(uint)(iVar19 < auVar131._4_4_);
            auVar61._8_4_ = -(uint)(iVar20 < auVar131._8_4_);
            auVar61._12_4_ = -(uint)(iVar25 < auVar131._12_4_);
            auVar141._4_4_ = auVar61._0_4_;
            auVar141._0_4_ = auVar61._0_4_;
            auVar141._8_4_ = auVar61._8_4_;
            auVar141._12_4_ = auVar61._8_4_;
            iVar152 = -(uint)(auVar131._4_4_ == iVar19);
            iVar156 = -(uint)(auVar131._12_4_ == iVar25);
            auVar150._4_4_ = iVar152;
            auVar150._0_4_ = iVar152;
            auVar150._8_4_ = iVar156;
            auVar150._12_4_ = iVar156;
            auVar155._4_4_ = auVar61._4_4_;
            auVar155._0_4_ = auVar61._4_4_;
            auVar155._8_4_ = auVar61._12_4_;
            auVar155._12_4_ = auVar61._12_4_;
            auVar131 = auVar150 & auVar141 | auVar155;
            auVar131 = packssdw(auVar131,auVar131);
            auVar131 = packssdw(auVar131 ^ auVar52,auVar131 ^ auVar52);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar30[-0x28] = 0xff;
            }
            auVar131 = pshufhw(auVar131,auVar141,0x84);
            auVar57 = pshufhw(auVar61,auVar150,0x84);
            auVar133 = pshufhw(auVar131,auVar155,0x84);
            auVar131 = (auVar133 | auVar57 & auVar131) ^ auVar52;
            auVar131 = packssdw(auVar131,auVar131);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131._10_2_ >> 8 & 1) != 0) {
              puVar30[-0x2c] = 0xff;
            }
            auVar131 = (auVar129 | _DAT_00256880) ^ auVar122;
            auVar62._0_4_ = -(uint)(iVar14 < auVar131._0_4_);
            auVar62._4_4_ = -(uint)(iVar19 < auVar131._4_4_);
            auVar62._8_4_ = -(uint)(iVar20 < auVar131._8_4_);
            auVar62._12_4_ = -(uint)(iVar25 < auVar131._12_4_);
            auVar151._4_4_ = auVar62._0_4_;
            auVar151._0_4_ = auVar62._0_4_;
            auVar151._8_4_ = auVar62._8_4_;
            auVar151._12_4_ = auVar62._8_4_;
            auVar57 = pshuflw(auVar155,auVar151,0xe8);
            auVar51._0_4_ = -(uint)(auVar131._0_4_ == iVar14);
            auVar51._4_4_ = -(uint)(auVar131._4_4_ == iVar19);
            auVar51._8_4_ = -(uint)(auVar131._8_4_ == iVar20);
            auVar51._12_4_ = -(uint)(auVar131._12_4_ == iVar25);
            auVar142._4_4_ = auVar51._4_4_;
            auVar142._0_4_ = auVar51._4_4_;
            auVar142._8_4_ = auVar51._12_4_;
            auVar142._12_4_ = auVar51._12_4_;
            auVar131 = pshuflw(auVar51,auVar142,0xe8);
            auVar143._4_4_ = auVar62._4_4_;
            auVar143._0_4_ = auVar62._4_4_;
            auVar143._8_4_ = auVar62._12_4_;
            auVar143._12_4_ = auVar62._12_4_;
            auVar133 = pshuflw(auVar62,auVar143,0xe8);
            auVar131 = packssdw(auVar131 & auVar57,(auVar133 | auVar131 & auVar57) ^ auVar52);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar30[-0x30] = 0xff;
            }
            auVar143 = auVar142 & auVar151 | auVar143;
            auVar133 = packssdw(auVar143,auVar143);
            auVar131 = packssdw(auVar131,auVar133 ^ auVar52);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131._12_2_ >> 8 & 1) != 0) {
              puVar30[-0x34] = 0xff;
            }
            auVar133 = (auVar129 | _DAT_00256870) ^ auVar122;
            auVar131._0_4_ = -(uint)(iVar14 < auVar133._0_4_);
            auVar131._4_4_ = -(uint)(iVar19 < auVar133._4_4_);
            auVar131._8_4_ = -(uint)(iVar20 < auVar133._8_4_);
            auVar131._12_4_ = -(uint)(iVar25 < auVar133._12_4_);
            auVar144._4_4_ = auVar131._0_4_;
            auVar144._0_4_ = auVar131._0_4_;
            auVar144._8_4_ = auVar131._8_4_;
            auVar144._12_4_ = auVar131._8_4_;
            auVar130._4_4_ = -(uint)(auVar133._4_4_ == iVar19);
            auVar130._12_4_ = -(uint)(auVar133._12_4_ == iVar25);
            auVar130._0_4_ = auVar130._4_4_;
            auVar130._8_4_ = auVar130._12_4_;
            auVar132._4_4_ = auVar131._4_4_;
            auVar132._0_4_ = auVar131._4_4_;
            auVar132._8_4_ = auVar131._12_4_;
            auVar132._12_4_ = auVar131._12_4_;
            auVar133 = auVar130 & auVar144 | auVar132;
            auVar131 = packssdw(auVar131,auVar133);
            auVar131 = packssdw(auVar131 ^ auVar52,auVar131 ^ auVar52);
            auVar131 = packsswb(auVar131,auVar131);
            if ((auVar131 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar30[-0x38] = 0xff;
            }
            auVar131 = pshufhw(auVar131,auVar144,0x84);
            in_XMM2 = pshufhw(auVar133,auVar130,0x84);
            in_XMM2 = in_XMM2 & auVar131;
            auVar131 = pshufhw(auVar131,auVar132,0x84);
            auVar131 = (auVar131 | in_XMM2) ^ auVar52;
            auVar131 = packssdw(auVar131,auVar131);
            in_XMM1 = packsswb(auVar131,auVar131);
            if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
              puVar30[-0x3c] = 0xff;
            }
            uVar35 = uVar35 + 0x10;
            puVar30 = puVar30 + -0x40;
          } while ((uVar31 + 0x10 & 0x3ffffff0) != uVar35);
        }
        if (0 < (int)sVar17) {
          uVar15 = (int)s->img_y >> 1;
          if (0 < (int)uVar15) {
            uVar32 = s->img_x * iVar16;
            uVar31 = (s->img_y - 1) * uVar32;
            uVar35 = 0;
            uVar40 = 0;
            do {
              if (0 < (int)uVar32) {
                uVar37 = 0;
                do {
                  uVar11 = *(uchar *)((long)local_89b8 + uVar37 + uVar35);
                  *(uchar *)((long)local_89b8 + uVar37 + uVar35) =
                       *(uchar *)((long)local_89b8 + uVar37 + uVar31);
                  *(uchar *)((long)local_89b8 + uVar37 + uVar31) = uVar11;
                  uVar37 = uVar37 + 1;
                } while (uVar32 != uVar37);
              }
              uVar40 = uVar40 + 1;
              uVar31 = uVar31 - uVar32;
              uVar35 = (ulong)((int)uVar35 + uVar32);
            } while (uVar40 != uVar15);
          }
        }
        if ((iVar16 != req_comp && req_comp != 0) &&
           (local_89b8 = (stbi__uint16 *)
                         stbi__convert_format((uchar *)local_89b8,iVar16,req_comp,s->img_x,s->img_y)
           , local_89b8 == (stbi__uint16 *)0x0)) {
          return (void *)0x0;
        }
        *x = s->img_x;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return (uchar *)local_89b8;
        }
        return (uchar *)local_89b8;
      }
LAB_001b8516:
      lVar34 = *in_FS_OFFSET;
      pcVar33 = "outofmem";
      goto LAB_001b6483;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar28 = s->img_buffer;
      goto LAB_001b64bf;
    }
LAB_001b663d:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar14 = stbi__gif_test(s);
    if (iVar14 != 0) {
      memset(&local_88a8,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,two_back);
      if (data == s) {
        data = (stbi__context *)0x0;
      }
      if (data == (stbi__context *)0x0) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a8.w;
        *y = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      free(local_88a8.background);
      return data;
    }
    iVar14 = stbi__get16be(s);
    uVar15 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar15 | iVar14 << 0x10) != 0x38425053) {
      iVar14 = stbi__pic_test(s);
      if (iVar14 != 0) {
        pvVar26 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar26;
      }
      iVar14 = stbi__jpeg_test(s);
      if (iVar14 != 0) {
        pvVar26 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
        return pvVar26;
      }
      iVar14 = stbi__pnm_test(s);
      if (iVar14 != 0) {
        pvVar26 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar26;
      }
      iVar14 = stbi__hdr_test(s);
      if (iVar14 != 0) {
        data_00 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar28 = stbi__hdr_to_ldr(data_00,*x,*y,req_comp);
        return psVar28;
      }
      iVar14 = stbi__tga_test(s);
      if (iVar14 != 0) {
        pvVar26 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar26;
      }
      lVar34 = *in_FS_OFFSET;
      pcVar33 = "unknown image type";
      goto LAB_001b6483;
    }
    iVar14 = stbi__get16be(s);
    uVar15 = stbi__get16be(s);
    if ((uVar15 | iVar14 << 0x10) != 0x38425053) {
      lVar34 = *in_FS_OFFSET;
      pcVar33 = "not PSD";
      goto LAB_001b6483;
    }
    iVar14 = stbi__get16be(s);
    if (iVar14 != 1) {
      lVar34 = *in_FS_OFFSET;
      pcVar33 = "wrong version";
      goto LAB_001b6483;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001b69a2:
      s->img_buffer = s->img_buffer + 6;
    }
    else {
      iVar14 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (5 < iVar14) goto LAB_001b69a2;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar14);
    }
    uVar15 = stbi__get16be(s);
    if (0x10 < uVar15) {
      lVar34 = *in_FS_OFFSET;
      pcVar33 = "wrong channel count";
      goto LAB_001b6483;
    }
    iVar14 = stbi__get16be(s);
    uVar38 = iVar14 * 0x10000;
    uVar31 = stbi__get16be(s);
    uVar21 = uVar38 + uVar31;
    iVar14 = stbi__get16be(s);
    uVar32 = stbi__get16be(s);
    if ((int)uVar21 < 0x1000001) {
      uVar22 = iVar14 * 0x10000;
      uVar23 = uVar22 + uVar32;
      if ((int)uVar23 < 0x1000001) {
        iVar14 = stbi__get16be(s);
        if ((iVar14 != 8) && (iVar14 != 0x10)) {
          lVar34 = *in_FS_OFFSET;
          pcVar33 = "unsupported bit depth";
          goto LAB_001b6483;
        }
        iVar16 = stbi__get16be(s);
        if (iVar16 != 3) {
          lVar34 = *in_FS_OFFSET;
          pcVar33 = "wrong color format";
          goto LAB_001b6483;
        }
        sVar17 = stbi__get32be(s);
        stbi__skip(s,sVar17);
        sVar17 = stbi__get32be(s);
        stbi__skip(s,sVar17);
        sVar17 = stbi__get32be(s);
        stbi__skip(s,sVar17);
        uVar18 = stbi__get16be(s);
        if (1 < uVar18) {
          lVar34 = *in_FS_OFFSET;
          pcVar33 = "bad compression";
          goto LAB_001b6483;
        }
        iVar16 = stbi__mad3sizes_valid(4,uVar23,uVar21,0);
        if (iVar16 != 0) {
          if (((bpc == 0x10) && (iVar14 == 0x10)) && (uVar18 == 0)) {
            local_89b8 = (stbi__uint16 *)stbi__malloc_mad3(8,uVar23,uVar21,0);
            ri->bits_per_channel = 0x10;
          }
          else {
            local_89b8 = (stbi__uint16 *)malloc((long)(int)(uVar21 * uVar23 * 4));
          }
          if (local_89b8 != (stbi__uint16 *)0x0) {
            iVar16 = uVar23 * uVar21;
            if (uVar18 == 0) {
              lVar34 = (ulong)((uVar31 | uVar38) * (uVar32 | uVar22)) - 1;
              auVar45._8_4_ = (int)lVar34;
              auVar45._0_8_ = lVar34;
              auVar45._12_4_ = (int)((ulong)lVar34 >> 0x20);
              psVar36 = local_89b8 + 0x1e;
              uVar18 = (uVar31 + uVar38) * (uVar32 + uVar22);
              psVar27 = local_89b8 + 0x1c;
              uVar35 = 0;
              auVar128._8_4_ = 0xffffffff;
              auVar128._0_8_ = 0xffffffffffffffff;
              auVar128._12_4_ = 0xffffffff;
              auVar122 = _DAT_0024d060;
              local_8960 = local_89b8;
              local_8958 = local_89b8;
              do {
                if (uVar35 < uVar15) {
                  if (ri->bits_per_channel == 0x10) {
                    if (0 < iVar16) {
                      lVar34 = 0;
                      do {
                        iVar19 = stbi__get16be(s);
                        auVar122 = _DAT_0024d060;
                        auVar128._8_4_ = 0xffffffff;
                        auVar128._0_8_ = 0xffffffffffffffff;
                        auVar128._12_4_ = 0xffffffff;
                        local_8960[lVar34 * 4] = (stbi__uint16)iVar19;
                        lVar34 = lVar34 + 1;
                      } while (uVar18 != (uint)lVar34);
                    }
                  }
                  else if (iVar14 == 0x10) {
                    if (0 < iVar16) {
                      lVar34 = 0;
                      do {
                        iVar19 = stbi__get16be(s);
                        auVar122 = _DAT_0024d060;
                        auVar128._8_4_ = 0xffffffff;
                        auVar128._0_8_ = 0xffffffffffffffff;
                        auVar128._12_4_ = 0xffffffff;
                        *(char *)(local_8958 + lVar34 * 2) = (char)((uint)iVar19 >> 8);
                        lVar34 = lVar34 + 1;
                      } while (uVar18 != (uint)lVar34);
                    }
                  }
                  else if (0 < iVar16) {
                    lVar34 = 0;
                    do {
                      psVar28 = s->img_buffer;
                      if (psVar28 < s->img_buffer_end) {
LAB_001b8d8b:
                        s->img_buffer = psVar28 + 1;
                        sVar9 = *psVar28;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          auVar128._8_4_ = 0xffffffff;
                          auVar128._0_8_ = 0xffffffffffffffff;
                          auVar128._12_4_ = 0xffffffff;
                          psVar28 = s->img_buffer;
                          auVar122 = _DAT_0024d060;
                          goto LAB_001b8d8b;
                        }
                        sVar9 = '\0';
                      }
                      *(stbi_uc *)(local_8958 + lVar34 * 2) = sVar9;
                      lVar34 = lVar34 + 1;
                    } while (uVar18 != (uint)lVar34);
                  }
                }
                else if (iVar14 == 0x10 && bpc == 0x10) {
                  if (0 < iVar16) {
                    sVar13 = -(ushort)(uVar35 == 3);
                    uVar40 = 0;
                    do {
                      auVar46._8_4_ = (int)uVar40;
                      auVar46._0_8_ = uVar40;
                      auVar46._12_4_ = (int)(uVar40 >> 0x20);
                      auVar54 = auVar45 ^ auVar122;
                      auVar75 = (auVar46 | _DAT_00255300) ^ auVar122;
                      iVar19 = auVar54._0_4_;
                      iVar156 = -(uint)(iVar19 < auVar75._0_4_);
                      iVar20 = auVar54._4_4_;
                      auVar77._4_4_ = -(uint)(iVar20 < auVar75._4_4_);
                      iVar25 = auVar54._8_4_;
                      iVar24 = -(uint)(iVar25 < auVar75._8_4_);
                      iVar152 = auVar54._12_4_;
                      auVar77._12_4_ = -(uint)(iVar152 < auVar75._12_4_);
                      auVar102._4_4_ = iVar156;
                      auVar102._0_4_ = iVar156;
                      auVar102._8_4_ = iVar24;
                      auVar102._12_4_ = iVar24;
                      auVar54 = pshuflw(in_XMM5,auVar102,0xe8);
                      auVar76._4_4_ = -(uint)(auVar75._4_4_ == iVar20);
                      auVar76._12_4_ = -(uint)(auVar75._12_4_ == iVar152);
                      auVar76._0_4_ = auVar76._4_4_;
                      auVar76._8_4_ = auVar76._12_4_;
                      auVar126 = pshuflw(in_XMM6,auVar76,0xe8);
                      auVar77._0_4_ = auVar77._4_4_;
                      auVar77._8_4_ = auVar77._12_4_;
                      auVar75 = pshuflw(auVar54,auVar77,0xe8);
                      auVar75 = (auVar75 | auVar126 & auVar54) ^ auVar128;
                      auVar75 = packssdw(auVar75,auVar75);
                      if ((auVar75 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar27[uVar40 * 4 + 0xffffffffffffffe4] = sVar13;
                      }
                      auVar77 = auVar76 & auVar102 | auVar77;
                      auVar75 = packssdw(auVar77,auVar77);
                      auVar75 = packssdw(auVar75 ^ auVar128,auVar75 ^ auVar128);
                      if ((auVar75._0_4_ >> 0x10 & 1) != 0) {
                        psVar27[uVar40 * 4 + 0xffffffffffffffe8] = sVar13;
                      }
                      auVar75 = (auVar46 | _DAT_002552f0) ^ auVar122;
                      iVar156 = -(uint)(iVar19 < auVar75._0_4_);
                      auVar118._4_4_ = -(uint)(iVar20 < auVar75._4_4_);
                      iVar24 = -(uint)(iVar25 < auVar75._8_4_);
                      auVar118._12_4_ = -(uint)(iVar152 < auVar75._12_4_);
                      auVar78._4_4_ = iVar156;
                      auVar78._0_4_ = iVar156;
                      auVar78._8_4_ = iVar24;
                      auVar78._12_4_ = iVar24;
                      auVar103._4_4_ = -(uint)(auVar75._4_4_ == iVar20);
                      auVar103._12_4_ = -(uint)(auVar75._12_4_ == iVar152);
                      auVar103._0_4_ = auVar103._4_4_;
                      auVar103._8_4_ = auVar103._12_4_;
                      auVar118._0_4_ = auVar118._4_4_;
                      auVar118._8_4_ = auVar118._12_4_;
                      auVar75 = auVar103 & auVar78 | auVar118;
                      auVar75 = packssdw(auVar75,auVar75);
                      auVar75 = packssdw(auVar75 ^ auVar128,auVar75 ^ auVar128);
                      if ((auVar75 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar27[uVar40 * 4 + 0xffffffffffffffec] = sVar13;
                      }
                      auVar79 = pshufhw(auVar78,auVar78,0x84);
                      auVar52 = pshufhw(auVar103,auVar103,0x84);
                      auVar80 = pshufhw(auVar79,auVar118,0x84);
                      auVar79 = (auVar80 | auVar52 & auVar79) ^ auVar128;
                      auVar79 = packssdw(auVar79,auVar79);
                      if ((auVar79 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar27[uVar40 * 4 + 0xfffffffffffffff0] = sVar13;
                      }
                      auVar79 = (auVar46 | _DAT_002568c0) ^ auVar122;
                      iVar156 = -(uint)(iVar19 < auVar79._0_4_);
                      auVar82._4_4_ = -(uint)(iVar20 < auVar79._4_4_);
                      iVar24 = -(uint)(iVar25 < auVar79._8_4_);
                      auVar82._12_4_ = -(uint)(iVar152 < auVar79._12_4_);
                      auVar104._4_4_ = iVar156;
                      auVar104._0_4_ = iVar156;
                      auVar104._8_4_ = iVar24;
                      auVar104._12_4_ = iVar24;
                      auVar75 = pshuflw(auVar75,auVar104,0xe8);
                      auVar81._4_4_ = -(uint)(auVar79._4_4_ == iVar20);
                      auVar81._12_4_ = -(uint)(auVar79._12_4_ == iVar152);
                      auVar81._0_4_ = auVar81._4_4_;
                      auVar81._8_4_ = auVar81._12_4_;
                      in_XMM6 = pshuflw(auVar126 & auVar54,auVar81,0xe8);
                      in_XMM6 = in_XMM6 & auVar75;
                      auVar82._0_4_ = auVar82._4_4_;
                      auVar82._8_4_ = auVar82._12_4_;
                      auVar54 = pshuflw(auVar75,auVar82,0xe8);
                      auVar54 = (auVar54 | in_XMM6) ^ auVar128;
                      in_XMM5 = packssdw(auVar54,auVar54);
                      if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar27[uVar40 * 4 + 0xfffffffffffffff4] = sVar13;
                      }
                      auVar82 = auVar81 & auVar104 | auVar82;
                      auVar54 = packssdw(auVar82,auVar82);
                      auVar54 = packssdw(auVar54 ^ auVar128,auVar54 ^ auVar128);
                      if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        psVar27[uVar40 * 4 + 0xfffffffffffffff8] = sVar13;
                      }
                      auVar54 = (auVar46 | _DAT_002568b0) ^ auVar122;
                      auVar105._0_4_ = -(uint)(iVar19 < auVar54._0_4_);
                      auVar105._4_4_ = -(uint)(iVar20 < auVar54._4_4_);
                      auVar105._8_4_ = -(uint)(iVar25 < auVar54._8_4_);
                      auVar105._12_4_ = -(uint)(iVar152 < auVar54._12_4_);
                      auVar83._4_4_ = auVar105._0_4_;
                      auVar83._0_4_ = auVar105._0_4_;
                      auVar83._8_4_ = auVar105._8_4_;
                      auVar83._12_4_ = auVar105._8_4_;
                      auVar47._4_4_ = -(uint)(auVar54._4_4_ == iVar20);
                      auVar47._12_4_ = -(uint)(auVar54._12_4_ == iVar152);
                      auVar47._0_4_ = auVar47._4_4_;
                      auVar47._8_4_ = auVar47._12_4_;
                      auVar55._4_4_ = auVar105._4_4_;
                      auVar55._0_4_ = auVar105._4_4_;
                      auVar55._8_4_ = auVar105._12_4_;
                      auVar55._12_4_ = auVar105._12_4_;
                      auVar54 = packssdw(auVar105,auVar47 & auVar83 | auVar55);
                      auVar54 = packssdw(auVar54 ^ auVar128,auVar54 ^ auVar128);
                      if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar27[uVar40 * 4 + 0xfffffffffffffffc] = sVar13;
                      }
                      auVar126 = pshufhw(auVar83,auVar83,0x84);
                      auVar54 = pshufhw(auVar47,auVar47,0x84);
                      auVar75 = pshufhw(auVar55,auVar55,0x84);
                      auVar54 = packssdw(auVar54 & auVar126,
                                         (auVar75 | auVar54 & auVar126) ^ auVar128);
                      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar27[uVar40 * 4] = sVar13;
                      }
                      uVar40 = uVar40 + 8;
                    } while (((ulong)uVar18 + 7 & 0xfffffffffffffff8) != uVar40);
                  }
                }
                else if (0 < iVar16) {
                  cVar12 = -(uVar35 == 3);
                  uVar40 = 0;
                  do {
                    auVar54._8_4_ = (int)uVar40;
                    auVar54._0_8_ = uVar40;
                    auVar54._12_4_ = (int)(uVar40 >> 0x20);
                    auVar75 = auVar45 ^ auVar122;
                    auVar126 = (auVar54 | _DAT_00255300) ^ auVar122;
                    iVar19 = auVar75._0_4_;
                    iVar156 = -(uint)(iVar19 < auVar126._0_4_);
                    iVar20 = auVar75._4_4_;
                    auVar79._4_4_ = -(uint)(iVar20 < auVar126._4_4_);
                    iVar25 = auVar75._8_4_;
                    iVar24 = -(uint)(iVar25 < auVar126._8_4_);
                    iVar152 = auVar75._12_4_;
                    auVar79._12_4_ = -(uint)(iVar152 < auVar126._12_4_);
                    auVar106._4_4_ = iVar156;
                    auVar106._0_4_ = iVar156;
                    auVar106._8_4_ = iVar24;
                    auVar106._12_4_ = iVar24;
                    auVar80 = pshuflw(in_XMM5,auVar106,0xe8);
                    auVar75._4_4_ = -(uint)(auVar126._4_4_ == iVar20);
                    auVar75._12_4_ = -(uint)(auVar126._12_4_ == iVar152);
                    auVar75._0_4_ = auVar75._4_4_;
                    auVar75._8_4_ = auVar75._12_4_;
                    auVar52 = pshuflw(in_XMM6,auVar75,0xe8);
                    auVar79._0_4_ = auVar79._4_4_;
                    auVar79._8_4_ = auVar79._12_4_;
                    auVar126 = pshuflw(auVar80,auVar79,0xe8);
                    auVar126 = (auVar126 | auVar52 & auVar80) ^ auVar128;
                    auVar126 = packssdw(auVar126,auVar126);
                    if ((auVar126 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xffffffffffffffe2) = cVar12;
                    }
                    auVar79 = auVar75 & auVar106 | auVar79;
                    auVar75 = packssdw(auVar79,auVar79);
                    auVar75 = packssdw(auVar75 ^ auVar128,auVar75 ^ auVar128);
                    auVar75 = packsswb(auVar75,auVar75);
                    if ((auVar75._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xffffffffffffffe4) = cVar12;
                    }
                    auVar75 = (auVar54 | _DAT_002552f0) ^ auVar122;
                    iVar156 = -(uint)(iVar19 < auVar75._0_4_);
                    auVar119._4_4_ = -(uint)(iVar20 < auVar75._4_4_);
                    iVar24 = -(uint)(iVar25 < auVar75._8_4_);
                    auVar119._12_4_ = -(uint)(iVar152 < auVar75._12_4_);
                    auVar126._4_4_ = iVar156;
                    auVar126._0_4_ = iVar156;
                    auVar126._8_4_ = iVar24;
                    auVar126._12_4_ = iVar24;
                    auVar107._4_4_ = -(uint)(auVar75._4_4_ == iVar20);
                    auVar107._12_4_ = -(uint)(auVar75._12_4_ == iVar152);
                    auVar107._0_4_ = auVar107._4_4_;
                    auVar107._8_4_ = auVar107._12_4_;
                    auVar119._0_4_ = auVar119._4_4_;
                    auVar119._8_4_ = auVar119._12_4_;
                    auVar75 = auVar107 & auVar126 | auVar119;
                    auVar75 = packssdw(auVar75,auVar75);
                    auVar75 = packssdw(auVar75 ^ auVar128,auVar75 ^ auVar128);
                    auVar75 = packsswb(auVar75,auVar75);
                    if ((auVar75._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xffffffffffffffe6) = cVar12;
                    }
                    auVar126 = pshufhw(auVar126,auVar126,0x84);
                    auVar131 = pshufhw(auVar107,auVar107,0x84);
                    auVar79 = pshufhw(auVar126,auVar119,0x84);
                    auVar126 = (auVar79 | auVar131 & auVar126) ^ auVar128;
                    auVar126 = packssdw(auVar126,auVar126);
                    auVar126 = packsswb(auVar126,auVar126);
                    if ((auVar126._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xffffffffffffffe8) = cVar12;
                    }
                    auVar126 = (auVar54 | _DAT_002568c0) ^ auVar122;
                    iVar156 = -(uint)(iVar19 < auVar126._0_4_);
                    auVar85._4_4_ = -(uint)(iVar20 < auVar126._4_4_);
                    iVar24 = -(uint)(iVar25 < auVar126._8_4_);
                    auVar85._12_4_ = -(uint)(iVar152 < auVar126._12_4_);
                    auVar108._4_4_ = iVar156;
                    auVar108._0_4_ = iVar156;
                    auVar108._8_4_ = iVar24;
                    auVar108._12_4_ = iVar24;
                    auVar75 = pshuflw(auVar75,auVar108,0xe8);
                    auVar84._4_4_ = -(uint)(auVar126._4_4_ == iVar20);
                    auVar84._12_4_ = -(uint)(auVar126._12_4_ == iVar152);
                    auVar84._0_4_ = auVar84._4_4_;
                    auVar84._8_4_ = auVar84._12_4_;
                    auVar79 = pshuflw(auVar52 & auVar80,auVar84,0xe8);
                    auVar85._0_4_ = auVar85._4_4_;
                    auVar85._8_4_ = auVar85._12_4_;
                    auVar126 = pshuflw(auVar75,auVar85,0xe8);
                    auVar126 = (auVar126 | auVar79 & auVar75) ^ auVar128;
                    auVar126 = packssdw(auVar126,auVar126);
                    auVar126 = packsswb(auVar126,auVar126);
                    if ((auVar126 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xffffffffffffffea) = cVar12;
                    }
                    auVar85 = auVar84 & auVar108 | auVar85;
                    auVar126 = packssdw(auVar85,auVar85);
                    auVar126 = packssdw(auVar126 ^ auVar128,auVar126 ^ auVar128);
                    auVar126 = packsswb(auVar126,auVar126);
                    if ((auVar126._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xffffffffffffffec) = cVar12;
                    }
                    auVar126 = (auVar54 | _DAT_002568b0) ^ auVar122;
                    iVar156 = -(uint)(iVar19 < auVar126._0_4_);
                    auVar120._4_4_ = -(uint)(iVar20 < auVar126._4_4_);
                    iVar24 = -(uint)(iVar25 < auVar126._8_4_);
                    auVar120._12_4_ = -(uint)(iVar152 < auVar126._12_4_);
                    auVar86._4_4_ = iVar156;
                    auVar86._0_4_ = iVar156;
                    auVar86._8_4_ = iVar24;
                    auVar86._12_4_ = iVar24;
                    auVar109._4_4_ = -(uint)(auVar126._4_4_ == iVar20);
                    auVar109._12_4_ = -(uint)(auVar126._12_4_ == iVar152);
                    auVar109._0_4_ = auVar109._4_4_;
                    auVar109._8_4_ = auVar109._12_4_;
                    auVar120._0_4_ = auVar120._4_4_;
                    auVar120._8_4_ = auVar120._12_4_;
                    auVar126 = auVar109 & auVar86 | auVar120;
                    auVar126 = packssdw(auVar126,auVar126);
                    auVar126 = packssdw(auVar126 ^ auVar128,auVar126 ^ auVar128);
                    auVar126 = packsswb(auVar126,auVar126);
                    if ((auVar126 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xffffffffffffffee) = cVar12;
                    }
                    auVar80 = pshufhw(auVar86,auVar86,0x84);
                    auVar131 = pshufhw(auVar109,auVar109,0x84);
                    auVar52 = pshufhw(auVar80,auVar120,0x84);
                    auVar80 = (auVar52 | auVar131 & auVar80) ^ auVar128;
                    auVar80 = packssdw(auVar80,auVar80);
                    auVar80 = packsswb(auVar80,auVar80);
                    if ((auVar80._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xfffffffffffffff0) = cVar12;
                    }
                    auVar80 = (auVar54 | _DAT_002568a0) ^ auVar122;
                    iVar156 = -(uint)(iVar19 < auVar80._0_4_);
                    auVar88._4_4_ = -(uint)(iVar20 < auVar80._4_4_);
                    iVar24 = -(uint)(iVar25 < auVar80._8_4_);
                    auVar88._12_4_ = -(uint)(iVar152 < auVar80._12_4_);
                    auVar110._4_4_ = iVar156;
                    auVar110._0_4_ = iVar156;
                    auVar110._8_4_ = iVar24;
                    auVar110._12_4_ = iVar24;
                    auVar126 = pshuflw(auVar126,auVar110,0xe8);
                    auVar87._4_4_ = -(uint)(auVar80._4_4_ == iVar20);
                    auVar87._12_4_ = -(uint)(auVar80._12_4_ == iVar152);
                    auVar87._0_4_ = auVar87._4_4_;
                    auVar87._8_4_ = auVar87._12_4_;
                    auVar79 = pshuflw(auVar79 & auVar75,auVar87,0xe8);
                    auVar88._0_4_ = auVar88._4_4_;
                    auVar88._8_4_ = auVar88._12_4_;
                    auVar75 = pshuflw(auVar126,auVar88,0xe8);
                    auVar75 = (auVar75 | auVar79 & auVar126) ^ auVar128;
                    auVar75 = packssdw(auVar75,auVar75);
                    auVar75 = packsswb(auVar75,auVar75);
                    if ((auVar75 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xfffffffffffffff2) = cVar12;
                    }
                    auVar88 = auVar87 & auVar110 | auVar88;
                    auVar75 = packssdw(auVar88,auVar88);
                    auVar75 = packssdw(auVar75 ^ auVar128,auVar75 ^ auVar128);
                    auVar75 = packsswb(auVar75,auVar75);
                    if ((auVar75._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xfffffffffffffff4) = cVar12;
                    }
                    auVar75 = (auVar54 | _DAT_00256890) ^ auVar122;
                    iVar156 = -(uint)(iVar19 < auVar75._0_4_);
                    auVar121._4_4_ = -(uint)(iVar20 < auVar75._4_4_);
                    iVar24 = -(uint)(iVar25 < auVar75._8_4_);
                    auVar121._12_4_ = -(uint)(iVar152 < auVar75._12_4_);
                    auVar89._4_4_ = iVar156;
                    auVar89._0_4_ = iVar156;
                    auVar89._8_4_ = iVar24;
                    auVar89._12_4_ = iVar24;
                    auVar111._4_4_ = -(uint)(auVar75._4_4_ == iVar20);
                    auVar111._12_4_ = -(uint)(auVar75._12_4_ == iVar152);
                    auVar111._0_4_ = auVar111._4_4_;
                    auVar111._8_4_ = auVar111._12_4_;
                    auVar121._0_4_ = auVar121._4_4_;
                    auVar121._8_4_ = auVar121._12_4_;
                    auVar75 = auVar111 & auVar89 | auVar121;
                    auVar75 = packssdw(auVar75,auVar75);
                    auVar75 = packssdw(auVar75 ^ auVar128,auVar75 ^ auVar128);
                    auVar75 = packsswb(auVar75,auVar75);
                    if ((auVar75 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xfffffffffffffff6) = cVar12;
                    }
                    auVar80 = pshufhw(auVar89,auVar89,0x84);
                    auVar131 = pshufhw(auVar111,auVar111,0x84);
                    auVar52 = pshufhw(auVar80,auVar121,0x84);
                    auVar80 = (auVar52 | auVar131 & auVar80) ^ auVar128;
                    auVar80 = packssdw(auVar80,auVar80);
                    auVar80 = packsswb(auVar80,auVar80);
                    if ((auVar80._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xfffffffffffffff8) = cVar12;
                    }
                    auVar80 = (auVar54 | _DAT_00256880) ^ auVar122;
                    iVar156 = -(uint)(iVar19 < auVar80._0_4_);
                    auVar91._4_4_ = -(uint)(iVar20 < auVar80._4_4_);
                    iVar24 = -(uint)(iVar25 < auVar80._8_4_);
                    auVar91._12_4_ = -(uint)(iVar152 < auVar80._12_4_);
                    auVar112._4_4_ = iVar156;
                    auVar112._0_4_ = iVar156;
                    auVar112._8_4_ = iVar24;
                    auVar112._12_4_ = iVar24;
                    auVar75 = pshuflw(auVar75,auVar112,0xe8);
                    auVar90._4_4_ = -(uint)(auVar80._4_4_ == iVar20);
                    auVar90._12_4_ = -(uint)(auVar80._12_4_ == iVar152);
                    auVar90._0_4_ = auVar90._4_4_;
                    auVar90._8_4_ = auVar90._12_4_;
                    in_XMM6 = pshuflw(auVar79 & auVar126,auVar90,0xe8);
                    in_XMM6 = in_XMM6 & auVar75;
                    auVar91._0_4_ = auVar91._4_4_;
                    auVar91._8_4_ = auVar91._12_4_;
                    auVar75 = pshuflw(auVar75,auVar91,0xe8);
                    auVar75 = (auVar75 | in_XMM6) ^ auVar128;
                    auVar75 = packssdw(auVar75,auVar75);
                    in_XMM5 = packsswb(auVar75,auVar75);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xfffffffffffffffa) = cVar12;
                    }
                    auVar91 = auVar90 & auVar112 | auVar91;
                    auVar75 = packssdw(auVar91,auVar91);
                    auVar75 = packssdw(auVar75 ^ auVar128,auVar75 ^ auVar128);
                    auVar75 = packsswb(auVar75,auVar75);
                    if ((auVar75._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xfffffffffffffffc) = cVar12;
                    }
                    auVar54 = (auVar54 | _DAT_00256870) ^ auVar122;
                    auVar113._0_4_ = -(uint)(iVar19 < auVar54._0_4_);
                    auVar113._4_4_ = -(uint)(iVar20 < auVar54._4_4_);
                    auVar113._8_4_ = -(uint)(iVar25 < auVar54._8_4_);
                    auVar113._12_4_ = -(uint)(iVar152 < auVar54._12_4_);
                    auVar92._4_4_ = auVar113._0_4_;
                    auVar92._0_4_ = auVar113._0_4_;
                    auVar92._8_4_ = auVar113._8_4_;
                    auVar92._12_4_ = auVar113._8_4_;
                    auVar48._4_4_ = -(uint)(auVar54._4_4_ == iVar20);
                    auVar48._12_4_ = -(uint)(auVar54._12_4_ == iVar152);
                    auVar48._0_4_ = auVar48._4_4_;
                    auVar48._8_4_ = auVar48._12_4_;
                    auVar56._4_4_ = auVar113._4_4_;
                    auVar56._0_4_ = auVar113._4_4_;
                    auVar56._8_4_ = auVar113._12_4_;
                    auVar56._12_4_ = auVar113._12_4_;
                    auVar54 = packssdw(auVar113,auVar48 & auVar92 | auVar56);
                    auVar54 = packssdw(auVar54 ^ auVar128,auVar54 ^ auVar128);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar36 + uVar40 * 2 + 0xfffffffffffffffe) = cVar12;
                    }
                    auVar126 = pshufhw(auVar92,auVar92,0x84);
                    auVar54 = pshufhw(auVar48,auVar48,0x84);
                    auVar75 = pshufhw(auVar56,auVar56,0x84);
                    auVar54 = packssdw(auVar54 & auVar126,(auVar75 | auVar54 & auVar126) ^ auVar128)
                    ;
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar36 + uVar40 * 2) = cVar12;
                    }
                    uVar40 = uVar40 + 0x10;
                  } while (((ulong)uVar18 + 0xf & 0xfffffffffffffff0) != uVar40);
                }
                uVar35 = uVar35 + 1;
                psVar36 = (stbi__uint16 *)((long)psVar36 + 1);
                psVar27 = psVar27 + 1;
                local_8958 = (stbi__uint16 *)((long)local_8958 + 1);
                local_8960 = local_8960 + 1;
              } while (uVar35 != 4);
            }
            else {
              stbi__skip(s,uVar15 * uVar21 * 2);
              lVar34 = (ulong)((uVar31 | uVar38) * (uVar32 | uVar22)) - 1;
              auVar127._8_4_ = (int)lVar34;
              auVar127._0_8_ = lVar34;
              auVar127._12_4_ = (int)((ulong)lVar34 >> 0x20);
              psVar27 = local_89b8 + 0x1e;
              uVar35 = 0;
              auVar122 = _DAT_00256870;
              auVar45 = _DAT_00256880;
              auVar128 = _DAT_00256890;
              auVar54 = _DAT_002568a0;
              auVar75 = _DAT_002568b0;
              auVar126 = _DAT_002568c0;
              auVar79 = _DAT_002552f0;
              auVar80 = _DAT_00255300;
              do {
                if (uVar35 < uVar15) {
                  iVar14 = stbi__psd_decode_rle(s,(stbi_uc *)((long)local_89b8 + uVar35),iVar16);
                  auVar122 = _DAT_00256870;
                  auVar45 = _DAT_00256880;
                  auVar128 = _DAT_00256890;
                  auVar54 = _DAT_002568a0;
                  auVar75 = _DAT_002568b0;
                  auVar126 = _DAT_002568c0;
                  auVar79 = _DAT_002552f0;
                  auVar80 = _DAT_00255300;
                  if (iVar14 == 0) {
                    free(local_89b8);
                    lVar34 = *in_FS_OFFSET;
                    pcVar33 = "corrupt";
                    goto LAB_001b6483;
                  }
                }
                else if (0 < iVar16) {
                  cVar12 = -(uVar35 == 3);
                  uVar40 = 0;
                  do {
                    auVar43._8_4_ = (int)uVar40;
                    auVar43._0_8_ = uVar40;
                    auVar43._12_4_ = (int)(uVar40 >> 0x20);
                    auVar52 = auVar127 ^ _DAT_0024d060;
                    auVar131 = (auVar43 | auVar80) ^ _DAT_0024d060;
                    iVar14 = auVar52._0_4_;
                    iVar152 = -(uint)(iVar14 < auVar131._0_4_);
                    iVar19 = auVar52._4_4_;
                    auVar64._4_4_ = -(uint)(iVar19 < auVar131._4_4_);
                    iVar20 = auVar52._8_4_;
                    iVar156 = -(uint)(iVar20 < auVar131._8_4_);
                    iVar25 = auVar52._12_4_;
                    auVar64._12_4_ = -(uint)(iVar25 < auVar131._12_4_);
                    auVar94._4_4_ = iVar152;
                    auVar94._0_4_ = iVar152;
                    auVar94._8_4_ = iVar156;
                    auVar94._12_4_ = iVar156;
                    auVar52 = pshuflw(in_XMM5,auVar94,0xe8);
                    auVar63._4_4_ = -(uint)(auVar131._4_4_ == iVar19);
                    auVar63._12_4_ = -(uint)(auVar131._12_4_ == iVar25);
                    auVar63._0_4_ = auVar63._4_4_;
                    auVar63._8_4_ = auVar63._12_4_;
                    auVar133 = pshuflw(in_XMM6,auVar63,0xe8);
                    auVar64._0_4_ = auVar64._4_4_;
                    auVar64._8_4_ = auVar64._12_4_;
                    auVar131 = pshuflw(auVar52,auVar64,0xe8);
                    auVar123._8_4_ = 0xffffffff;
                    auVar123._0_8_ = 0xffffffffffffffff;
                    auVar123._12_4_ = 0xffffffff;
                    auVar52 = (auVar131 | auVar133 & auVar52) ^ auVar123;
                    auVar52 = packssdw(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xffffffffffffffe2) = cVar12;
                    }
                    auVar64 = auVar63 & auVar94 | auVar64;
                    auVar52 = packssdw(auVar64,auVar64);
                    auVar52 = packssdw(auVar52 ^ auVar123,auVar52 ^ auVar123);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xffffffffffffffe4) = cVar12;
                    }
                    auVar52 = (auVar43 | auVar79) ^ _DAT_0024d060;
                    iVar152 = -(uint)(iVar14 < auVar52._0_4_);
                    auVar115._4_4_ = -(uint)(iVar19 < auVar52._4_4_);
                    iVar156 = -(uint)(iVar20 < auVar52._8_4_);
                    auVar115._12_4_ = -(uint)(iVar25 < auVar52._12_4_);
                    auVar65._4_4_ = iVar152;
                    auVar65._0_4_ = iVar152;
                    auVar65._8_4_ = iVar156;
                    auVar65._12_4_ = iVar156;
                    auVar95._4_4_ = -(uint)(auVar52._4_4_ == iVar19);
                    auVar95._12_4_ = -(uint)(auVar52._12_4_ == iVar25);
                    auVar95._0_4_ = auVar95._4_4_;
                    auVar95._8_4_ = auVar95._12_4_;
                    auVar115._0_4_ = auVar115._4_4_;
                    auVar115._8_4_ = auVar115._12_4_;
                    auVar52 = auVar95 & auVar65 | auVar115;
                    auVar52 = packssdw(auVar52,auVar52);
                    auVar52 = packssdw(auVar52 ^ auVar123,auVar52 ^ auVar123);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xffffffffffffffe6) = cVar12;
                    }
                    auVar131 = pshufhw(auVar65,auVar65,0x84);
                    auVar57 = pshufhw(auVar95,auVar95,0x84);
                    auVar133 = pshufhw(auVar131,auVar115,0x84);
                    auVar131 = (auVar133 | auVar57 & auVar131) ^ auVar123;
                    auVar131 = packssdw(auVar131,auVar131);
                    auVar131 = packsswb(auVar131,auVar131);
                    if ((auVar131._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xffffffffffffffe8) = cVar12;
                    }
                    auVar131 = (auVar43 | auVar126) ^ _DAT_0024d060;
                    iVar152 = -(uint)(iVar14 < auVar131._0_4_);
                    auVar67._4_4_ = -(uint)(iVar19 < auVar131._4_4_);
                    iVar156 = -(uint)(iVar20 < auVar131._8_4_);
                    auVar67._12_4_ = -(uint)(iVar25 < auVar131._12_4_);
                    auVar96._4_4_ = iVar152;
                    auVar96._0_4_ = iVar152;
                    auVar96._8_4_ = iVar156;
                    auVar96._12_4_ = iVar156;
                    auVar52 = pshuflw(auVar52,auVar96,0xe8);
                    auVar66._4_4_ = -(uint)(auVar131._4_4_ == iVar19);
                    auVar66._12_4_ = -(uint)(auVar131._12_4_ == iVar25);
                    auVar66._0_4_ = auVar66._4_4_;
                    auVar66._8_4_ = auVar66._12_4_;
                    auVar133 = pshuflw(auVar123,auVar66,0xe8);
                    auVar67._0_4_ = auVar67._4_4_;
                    auVar67._8_4_ = auVar67._12_4_;
                    auVar131 = pshuflw(auVar52,auVar67,0xe8);
                    auVar124._8_4_ = 0xffffffff;
                    auVar124._0_8_ = 0xffffffffffffffff;
                    auVar124._12_4_ = 0xffffffff;
                    auVar52 = (auVar131 | auVar133 & auVar52) ^ auVar124;
                    auVar52 = packssdw(auVar52,auVar52);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xffffffffffffffea) = cVar12;
                    }
                    auVar67 = auVar66 & auVar96 | auVar67;
                    auVar52 = packssdw(auVar67,auVar67);
                    auVar52 = packssdw(auVar52 ^ auVar124,auVar52 ^ auVar124);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xffffffffffffffec) = cVar12;
                    }
                    auVar52 = (auVar43 | auVar75) ^ _DAT_0024d060;
                    iVar152 = -(uint)(iVar14 < auVar52._0_4_);
                    auVar116._4_4_ = -(uint)(iVar19 < auVar52._4_4_);
                    iVar156 = -(uint)(iVar20 < auVar52._8_4_);
                    auVar116._12_4_ = -(uint)(iVar25 < auVar52._12_4_);
                    auVar68._4_4_ = iVar152;
                    auVar68._0_4_ = iVar152;
                    auVar68._8_4_ = iVar156;
                    auVar68._12_4_ = iVar156;
                    auVar97._4_4_ = -(uint)(auVar52._4_4_ == iVar19);
                    auVar97._12_4_ = -(uint)(auVar52._12_4_ == iVar25);
                    auVar97._0_4_ = auVar97._4_4_;
                    auVar97._8_4_ = auVar97._12_4_;
                    auVar116._0_4_ = auVar116._4_4_;
                    auVar116._8_4_ = auVar116._12_4_;
                    auVar52 = auVar97 & auVar68 | auVar116;
                    auVar52 = packssdw(auVar52,auVar52);
                    auVar52 = packssdw(auVar52 ^ auVar124,auVar52 ^ auVar124);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xffffffffffffffee) = cVar12;
                    }
                    auVar131 = pshufhw(auVar68,auVar68,0x84);
                    auVar57 = pshufhw(auVar97,auVar97,0x84);
                    auVar133 = pshufhw(auVar131,auVar116,0x84);
                    auVar131 = (auVar133 | auVar57 & auVar131) ^ auVar124;
                    auVar131 = packssdw(auVar131,auVar131);
                    auVar131 = packsswb(auVar131,auVar131);
                    if ((auVar131._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xfffffffffffffff0) = cVar12;
                    }
                    auVar131 = (auVar43 | auVar54) ^ _DAT_0024d060;
                    iVar152 = -(uint)(iVar14 < auVar131._0_4_);
                    auVar70._4_4_ = -(uint)(iVar19 < auVar131._4_4_);
                    iVar156 = -(uint)(iVar20 < auVar131._8_4_);
                    auVar70._12_4_ = -(uint)(iVar25 < auVar131._12_4_);
                    auVar98._4_4_ = iVar152;
                    auVar98._0_4_ = iVar152;
                    auVar98._8_4_ = iVar156;
                    auVar98._12_4_ = iVar156;
                    auVar52 = pshuflw(auVar52,auVar98,0xe8);
                    auVar69._4_4_ = -(uint)(auVar131._4_4_ == iVar19);
                    auVar69._12_4_ = -(uint)(auVar131._12_4_ == iVar25);
                    auVar69._0_4_ = auVar69._4_4_;
                    auVar69._8_4_ = auVar69._12_4_;
                    auVar133 = pshuflw(auVar124,auVar69,0xe8);
                    auVar70._0_4_ = auVar70._4_4_;
                    auVar70._8_4_ = auVar70._12_4_;
                    auVar131 = pshuflw(auVar52,auVar70,0xe8);
                    auVar125._8_4_ = 0xffffffff;
                    auVar125._0_8_ = 0xffffffffffffffff;
                    auVar125._12_4_ = 0xffffffff;
                    auVar52 = (auVar131 | auVar133 & auVar52) ^ auVar125;
                    auVar52 = packssdw(auVar52,auVar52);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xfffffffffffffff2) = cVar12;
                    }
                    auVar70 = auVar69 & auVar98 | auVar70;
                    auVar52 = packssdw(auVar70,auVar70);
                    auVar52 = packssdw(auVar52 ^ auVar125,auVar52 ^ auVar125);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xfffffffffffffff4) = cVar12;
                    }
                    auVar52 = (auVar43 | auVar128) ^ _DAT_0024d060;
                    iVar152 = -(uint)(iVar14 < auVar52._0_4_);
                    auVar117._4_4_ = -(uint)(iVar19 < auVar52._4_4_);
                    iVar156 = -(uint)(iVar20 < auVar52._8_4_);
                    auVar117._12_4_ = -(uint)(iVar25 < auVar52._12_4_);
                    auVar71._4_4_ = iVar152;
                    auVar71._0_4_ = iVar152;
                    auVar71._8_4_ = iVar156;
                    auVar71._12_4_ = iVar156;
                    auVar99._4_4_ = -(uint)(auVar52._4_4_ == iVar19);
                    auVar99._12_4_ = -(uint)(auVar52._12_4_ == iVar25);
                    auVar99._0_4_ = auVar99._4_4_;
                    auVar99._8_4_ = auVar99._12_4_;
                    auVar117._0_4_ = auVar117._4_4_;
                    auVar117._8_4_ = auVar117._12_4_;
                    auVar52 = auVar99 & auVar71 | auVar117;
                    auVar52 = packssdw(auVar52,auVar52);
                    auVar52 = packssdw(auVar52 ^ auVar125,auVar52 ^ auVar125);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xfffffffffffffff6) = cVar12;
                    }
                    auVar131 = pshufhw(auVar71,auVar71,0x84);
                    auVar57 = pshufhw(auVar99,auVar99,0x84);
                    auVar133 = pshufhw(auVar131,auVar117,0x84);
                    auVar131 = (auVar133 | auVar57 & auVar131) ^ auVar125;
                    auVar131 = packssdw(auVar131,auVar131);
                    auVar131 = packsswb(auVar131,auVar131);
                    if ((auVar131._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xfffffffffffffff8) = cVar12;
                    }
                    auVar131 = (auVar43 | auVar45) ^ _DAT_0024d060;
                    iVar152 = -(uint)(iVar14 < auVar131._0_4_);
                    auVar73._4_4_ = -(uint)(iVar19 < auVar131._4_4_);
                    iVar156 = -(uint)(iVar20 < auVar131._8_4_);
                    auVar73._12_4_ = -(uint)(iVar25 < auVar131._12_4_);
                    auVar100._4_4_ = iVar152;
                    auVar100._0_4_ = iVar152;
                    auVar100._8_4_ = iVar156;
                    auVar100._12_4_ = iVar156;
                    auVar52 = pshuflw(auVar52,auVar100,0xe8);
                    auVar72._4_4_ = -(uint)(auVar131._4_4_ == iVar19);
                    auVar72._12_4_ = -(uint)(auVar131._12_4_ == iVar25);
                    auVar72._0_4_ = auVar72._4_4_;
                    auVar72._8_4_ = auVar72._12_4_;
                    auVar133 = pshuflw(auVar125,auVar72,0xe8);
                    auVar73._0_4_ = auVar73._4_4_;
                    auVar73._8_4_ = auVar73._12_4_;
                    auVar131 = pshuflw(auVar52,auVar73,0xe8);
                    in_XMM6._8_4_ = 0xffffffff;
                    in_XMM6._0_8_ = 0xffffffffffffffff;
                    in_XMM6._12_4_ = 0xffffffff;
                    auVar52 = (auVar131 | auVar133 & auVar52) ^ in_XMM6;
                    auVar52 = packssdw(auVar52,auVar52);
                    in_XMM5 = packsswb(auVar52,auVar52);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xfffffffffffffffa) = cVar12;
                    }
                    auVar73 = auVar72 & auVar100 | auVar73;
                    auVar52 = packssdw(auVar73,auVar73);
                    auVar52 = packssdw(auVar52 ^ in_XMM6,auVar52 ^ in_XMM6);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xfffffffffffffffc) = cVar12;
                    }
                    auVar52 = (auVar43 | auVar122) ^ _DAT_0024d060;
                    auVar101._0_4_ = -(uint)(iVar14 < auVar52._0_4_);
                    auVar101._4_4_ = -(uint)(iVar19 < auVar52._4_4_);
                    auVar101._8_4_ = -(uint)(iVar20 < auVar52._8_4_);
                    auVar101._12_4_ = -(uint)(iVar25 < auVar52._12_4_);
                    auVar74._4_4_ = auVar101._0_4_;
                    auVar74._0_4_ = auVar101._0_4_;
                    auVar74._8_4_ = auVar101._8_4_;
                    auVar74._12_4_ = auVar101._8_4_;
                    auVar44._4_4_ = -(uint)(auVar52._4_4_ == iVar19);
                    auVar44._12_4_ = -(uint)(auVar52._12_4_ == iVar25);
                    auVar44._0_4_ = auVar44._4_4_;
                    auVar44._8_4_ = auVar44._12_4_;
                    auVar53._4_4_ = auVar101._4_4_;
                    auVar53._0_4_ = auVar101._4_4_;
                    auVar53._8_4_ = auVar101._12_4_;
                    auVar53._12_4_ = auVar101._12_4_;
                    auVar52 = packssdw(auVar101,auVar44 & auVar74 | auVar53);
                    auVar52 = packssdw(auVar52 ^ in_XMM6,auVar52 ^ in_XMM6);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar27 + uVar40 * 2 + 0xfffffffffffffffe) = cVar12;
                    }
                    auVar133 = pshufhw(auVar74,auVar74,0x84);
                    auVar52 = pshufhw(auVar44,auVar44,0x84);
                    auVar131 = pshufhw(auVar53,auVar53,0x84);
                    auVar52 = packssdw(auVar52 & auVar133,(auVar131 | auVar52 & auVar133) ^ in_XMM6)
                    ;
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar27 + uVar40 * 2) = cVar12;
                    }
                    uVar40 = uVar40 + 0x10;
                  } while (((ulong)((uVar31 + uVar38) * (uVar32 + uVar22)) + 0xf &
                           0xfffffffffffffff0) != uVar40);
                }
                uVar35 = uVar35 + 1;
                psVar27 = (stbi__uint16 *)((long)psVar27 + 1);
              } while (uVar35 != 4);
            }
            if (3 < uVar15) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < iVar16) {
                  uVar35 = 0;
                  do {
                    uVar2 = local_89b8[uVar35 * 4 + 3];
                    if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                      fVar114 = 1.0 / ((float)uVar2 / 65535.0);
                      fVar93 = (1.0 - fVar114) * 65535.0;
                      auVar122._0_4_ =
                           (int)(fVar93 + fVar114 * (float)(*(uint *)(local_89b8 + uVar35 * 4) &
                                                           0xffff));
                      auVar122._4_4_ =
                           (int)(fVar93 + fVar114 * (float)(*(uint *)(local_89b8 + uVar35 * 4) >>
                                                           0x10));
                      auVar122._8_4_ = (int)(fVar93 + fVar114 * 0.0);
                      auVar122._12_4_ = (int)(fVar93 + fVar114 * 0.0);
                      auVar122 = pshuflw(auVar122,auVar122,0xe8);
                      *(int *)(local_89b8 + uVar35 * 4) = auVar122._0_4_;
                      local_89b8[uVar35 * 4 + 2] =
                           (stbi__uint16)(int)((float)local_89b8[uVar35 * 4 + 2] * fVar114 + fVar93)
                      ;
                    }
                    uVar35 = uVar35 + 1;
                  } while ((uVar31 + uVar38) * (uVar32 + uVar22) != uVar35);
                }
              }
              else if (0 < iVar16) {
                uVar35 = 0;
                do {
                  bVar10 = *(byte *)((long)local_89b8 + uVar35 * 4 + 3);
                  if ((bVar10 != 0) && (bVar10 != 0xff)) {
                    fVar114 = 1.0 / ((float)bVar10 / 255.0);
                    fVar93 = (1.0 - fVar114) * 255.0;
                    *(char *)(local_89b8 + uVar35 * 2) =
                         (char)(int)((float)(byte)local_89b8[uVar35 * 2] * fVar114 + fVar93);
                    *(char *)((long)local_89b8 + uVar35 * 4 + 1) =
                         (char)(int)((float)*(byte *)((long)local_89b8 + uVar35 * 4 + 1) * fVar114 +
                                    fVar93);
                    *(char *)(local_89b8 + uVar35 * 2 + 1) =
                         (char)(int)((float)(byte)local_89b8[uVar35 * 2 + 1] * fVar114 + fVar93);
                  }
                  uVar35 = uVar35 + 1;
                } while ((uVar31 + uVar38) * (uVar32 + uVar22) != uVar35);
              }
            }
            if ((req_comp & 0xfffffffbU) != 0) {
              if (ri->bits_per_channel == 0x10) {
                local_89b8 = stbi__convert_format16(local_89b8,4,req_comp,uVar23,uVar21);
              }
              else {
                local_89b8 = (stbi__uint16 *)
                             stbi__convert_format((uchar *)local_89b8,4,req_comp,uVar23,uVar21);
              }
              if (local_89b8 == (stbi__uint16 *)0x0) {
                return (void *)0x0;
              }
            }
            if (comp != (int *)0x0) {
              *comp = 4;
            }
            *y = uVar21;
            *x = uVar23;
            return local_89b8;
          }
          goto LAB_001b8516;
        }
      }
    }
  }
LAB_001b712c:
  lVar34 = *in_FS_OFFSET;
  pcVar33 = "too large";
LAB_001b6483:
  *(char **)(lVar34 + -0x20) = pcVar33;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}